

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O1

void ngram_fwdflat_expand_all(ngram_search_t *ngs)

{
  int iVar1;
  int iVar2;
  int32 iVar3;
  long lVar4;
  ulong uVar5;
  
  ngs->n_expand_words = 0;
  iVar1 = (ngs->base).n_words;
  iVar2 = iVar1 + 0x3e;
  if (-1 < iVar1 + 0x1f) {
    iVar2 = iVar1 + 0x1f;
  }
  memset(ngs->expand_word_flag,0,(long)(iVar2 >> 5) << 2);
  if (0 < (long)iVar1) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      iVar3 = ngram_model_set_known_wid
                        (ngs->lmset,*(int32 *)((long)&((ngs->base).dict)->word->word + lVar4));
      if (iVar3 != 0) {
        ngs->fwdflat_wordlist[ngs->n_expand_words] = (int32)uVar5;
        ngs->expand_word_list[ngs->n_expand_words] = (int32)uVar5;
        ngs->expand_word_flag[uVar5 >> 5 & 0x7ffffff] =
             ngs->expand_word_flag[uVar5 >> 5 & 0x7ffffff] | 1 << ((byte)uVar5 & 0x1f);
        ngs->n_expand_words = ngs->n_expand_words + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while ((long)iVar1 != uVar5);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x52,"Utterance vocabulary contains %d words\n",(ulong)(uint)ngs->n_expand_words);
  ngs->expand_word_list[ngs->n_expand_words] = -1;
  ngs->fwdflat_wordlist[ngs->n_expand_words] = -1;
  return;
}

Assistant:

static void
ngram_fwdflat_expand_all(ngram_search_t *ngs)
{
    int n_words, i;

    /* For all "real words" (not fillers or <s>/</s>) in the dictionary,
     *
     * 1) Add the ones which are in the LM to the fwdflat wordlist
     * 2) And to the expansion list (since we are expanding all)
     */
    ngs->n_expand_words = 0;
    n_words = ps_search_n_words(ngs);
    bitvec_clear_all(ngs->expand_word_flag, ps_search_n_words(ngs));
    for (i = 0; i < n_words; ++i) {
        if (!ngram_model_set_known_wid(ngs->lmset,
                                       dict_basewid(ps_search_dict(ngs),i)))
            continue;
        ngs->fwdflat_wordlist[ngs->n_expand_words] = i;
        ngs->expand_word_list[ngs->n_expand_words] = i;
        bitvec_set(ngs->expand_word_flag, i);
        ngs->n_expand_words++;
    }
    E_INFO("Utterance vocabulary contains %d words\n", ngs->n_expand_words);
    ngs->expand_word_list[ngs->n_expand_words] = -1;
    ngs->fwdflat_wordlist[ngs->n_expand_words] = -1;
}